

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForScalar
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  string sStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string struct_var;
  string field_method;
  string field_field;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&field_method,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[7])(&struct_var,pIVar1,struct_def);
  GenIndents_abi_cxx11_(&sStack_188,this,2);
  std::operator+(&local_168,&sStack_188,"self.");
  std::operator+(&local_148,&local_168,&field_field);
  std::operator+(&local_128,&local_148," = ");
  std::operator+(&local_108,&local_128,&struct_var);
  std::operator+(&local_e8,&local_108,".");
  std::operator+(&local_c8,&local_e8,&field_method);
  std::operator+(&local_a8,&local_c8,"()");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&sStack_188);
  std::__cxx11::string::~string((string *)&struct_var);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void GenUnPackForScalar(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);

    code += GenIndents(2) + "self." + field_field + " = " + struct_var + "." +
            field_method + "()";
  }